

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,BinopExpression *binop_statement)

{
  ostream *poVar1;
  BinaryOperatorType type;
  string local_38;
  BinopExpression *local_18;
  BinopExpression *binop_statement_local;
  PrintVisitor *this_local;
  
  local_18 = binop_statement;
  binop_statement_local = (BinopExpression *)this;
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"BinopExpression: ");
  ToString_abi_cxx11_(&local_38,(IRT *)(ulong)(uint)(int)(char)local_18->operator_type_,type);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(local_18->first_->super_BaseElement)._vptr_BaseElement[2])();
  (*(local_18->second_->super_BaseElement)._vptr_BaseElement[2])(local_18->second_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(BinopExpression *binop_statement) {
  PrintTabs();
  stream_ << "BinopExpression: " << ToString(binop_statement->operator_type_) << std::endl;
  ++num_tabs_;
  binop_statement->first_->Accept(this);
  binop_statement->second_->Accept(this);
  --num_tabs_;
}